

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O2

btCollisionObject * __thiscall
btCollisionWorldImporter::createCollisionObject
          (btCollisionWorldImporter *this,btTransform *startTransform,btCollisionShape *shape,
          char *bodyName)

{
  btScalar bVar1;
  btScalar bVar2;
  btScalar bVar3;
  undefined8 uVar4;
  anon_union_8_2_511b660c_for_btHashPtr_0 this_00;
  btCollisionObject *colObj;
  anon_union_8_2_511b660c_for_btHashPtr_0 local_40 [2];
  char *newname;
  
  this_00.m_pointer = btCollisionObject::operator_new(0x150);
  btCollisionObject::btCollisionObject((btCollisionObject *)this_00.m_pointer);
  *(int *)((long)this_00.m_pointer + 0x148) = *(int *)((long)this_00.m_pointer + 0x148) + 1;
  uVar4 = *(undefined8 *)((startTransform->m_basis).m_el[0].m_floats + 2);
  *(undefined8 *)(((btTransform *)((long)this_00.m_pointer + 8))->m_basis).m_el[0].m_floats =
       *(undefined8 *)(startTransform->m_basis).m_el[0].m_floats;
  *(undefined8 *)((long)this_00.m_pointer + 0x10) = uVar4;
  uVar4 = *(undefined8 *)((startTransform->m_basis).m_el[1].m_floats + 2);
  *(undefined8 *)((btVector3 *)((long)this_00.m_pointer + 0x18))->m_floats =
       *(undefined8 *)(startTransform->m_basis).m_el[1].m_floats;
  *(undefined8 *)((long)this_00.m_pointer + 0x20) = uVar4;
  uVar4 = *(undefined8 *)((startTransform->m_basis).m_el[2].m_floats + 2);
  *(undefined8 *)((btVector3 *)((long)this_00.m_pointer + 0x28))->m_floats =
       *(undefined8 *)(startTransform->m_basis).m_el[2].m_floats;
  *(undefined8 *)((long)this_00.m_pointer + 0x30) = uVar4;
  bVar1 = (startTransform->m_origin).m_floats[1];
  bVar2 = (startTransform->m_origin).m_floats[2];
  bVar3 = (startTransform->m_origin).m_floats[3];
  ((btVector3 *)((long)this_00.m_pointer + 0x38))->m_floats[0] =
       (startTransform->m_origin).m_floats[0];
  *(btScalar *)((long)this_00.m_pointer + 0x3c) = bVar1;
  *(btScalar *)((long)this_00.m_pointer + 0x40) = bVar2;
  *(btScalar *)((long)this_00.m_pointer + 0x44) = bVar3;
  colObj = (btCollisionObject *)this_00.m_pointer;
  (**(code **)(*this_00.m_pointer + 0x10))(this_00.m_pointer,shape);
  (*this->m_collisionWorld->_vptr_btCollisionWorld[9])
            (this->m_collisionWorld,this_00.m_pointer,1,0xffffffffffffffff);
  if (bodyName != (char *)0x0) {
    newname = duplicateName(this,bodyName);
    local_40[0].m_pointer = this_00.m_pointer;
    btHashMap<btHashPtr,_const_char_*>::insert
              (&this->m_objectNameMap,(btHashPtr *)local_40,&newname);
    btHashString::btHashString((btHashString *)local_40,newname);
    btHashMap<btHashString,_btCollisionObject_*>::insert
              (&this->m_nameColObjMap,(btHashString *)local_40,&colObj);
  }
  btAlignedObjectArray<btCollisionObject_*>::push_back(&this->m_allocatedCollisionObjects,&colObj);
  return colObj;
}

Assistant:

btCollisionObject* btCollisionWorldImporter::createCollisionObject(const btTransform& startTransform,btCollisionShape* shape, const char* bodyName)
{
	btCollisionObject* colObj = new btCollisionObject();
	colObj->setWorldTransform(startTransform);
	colObj->setCollisionShape(shape);
	m_collisionWorld->addCollisionObject(colObj);//todo: flags etc

	if (bodyName)
	{
		char* newname = duplicateName(bodyName);
		m_objectNameMap.insert(colObj,newname);
		m_nameColObjMap.insert(newname,colObj);
	}
	m_allocatedCollisionObjects.push_back(colObj);

	return colObj;
}